

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1103bec::DropoutTest_NumBeforeLargerThanNumAfter_Test::TestBody
          (DropoutTest_NumBeforeLargerThanNumAfter_Test *this)

{
  initializer_list<int> __l;
  tran_low_t qcoeff_scan [32];
  uint32_t dropout_num_after;
  uint32_t dropout_num_before;
  TX_SIZE tx_size;
  tran_low_t *in_stack_0002d5f0;
  int in_stack_0002d5fc;
  int in_stack_0002d600;
  TX_TYPE in_stack_0002d606;
  TX_SIZE in_stack_0002d607;
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *in_stack_fffffffffffffea8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  iterator piVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *actual;
  
  this_00 = (vector<int,_std::allocator<int>_> *)0x0;
  Dropout(in_stack_0002d607,in_stack_0002d606,in_stack_0002d600,in_stack_0002d5fc,in_stack_0002d5f0)
  ;
  expected = (vector<int,_std::allocator<int>_> *)0x0;
  piVar1 = (iterator)0x0;
  pvVar2 = this_00;
  actual = this_00;
  std::allocator<int>::allocator((allocator<int> *)0xae77c3);
  __l._M_len = (size_type)pvVar2;
  __l._M_array = piVar1;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffeb0,__l,in_stack_fffffffffffffea8);
  ExpectArrayEq((tran_low_t *)actual,expected);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0xae7812);
  return;
}

Assistant:

TEST(DropoutTest, NumBeforeLargerThanNumAfter) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 2;
  // The second coeff (-2) doesn't seem to meet the dropout_num_before
  // criteria. But since the first coeff (1) will be dropped, it will meet
  // the criteria and should be dropped too.
  tran_low_t qcoeff_scan[] = { 0,  0, 0, 0, 1, 0, 0, 0,  // should be removed
                               -2, 0, 0, 0, 0, 0, 0, 0,  // should be removed
                               0,  0, 0, 0, 0, 0, 0, 0,  //
                               0,  0, 0, 0, 0, 0, 0, 0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0 });
}